

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkleblock.h
# Opt level: O0

void CPartialMerkleTree::SerializationOps<DataStream,CPartialMerkleTree,ActionUnserialize>(void)

{
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  DataStream *in_stack_ffffffffffffff98;
  uint *in_stack_ffffffffffffffa0;
  CPartialMerkleTree *obj;
  DataStream *in_stack_ffffffffffffffa8;
  _Bit_type *local_8;
  
  local_8 = *(_Bit_type **)(in_FS_OFFSET + 0x28);
  ActionUnserialize::
  SerReadWriteMany<DataStream,unsigned_int&,std::vector<uint256,std::allocator<uint256>>&>
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             (vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff98);
  obj = (CPartialMerkleTree *)&stack0xffffffffffffffe0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff98);
  ActionUnserialize::
  SerWrite<DataStream,CPartialMerkleTree&,CPartialMerkleTree::SerializationOps<DataStream,CPartialMerkleTree,ActionUnserialize>(CPartialMerkleTree&,DataStream&,ActionUnserialize)::_lambda(DataStream&,CPartialMerkleTree_const&)_1_>
            (in_stack_ffffffffffffffa8,obj,(anon_class_8_1_a7b7af8b *)in_stack_ffffffffffffff98);
  ActionUnserialize::
  SerReadWriteMany<DataStream,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
            (in_stack_ffffffffffffff98,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x518064);
  ActionUnserialize::
  SerRead<DataStream,CPartialMerkleTree&,CPartialMerkleTree::SerializationOps<DataStream,CPartialMerkleTree,ActionUnserialize>(CPartialMerkleTree&,DataStream&,ActionUnserialize)::_lambda(DataStream&,CPartialMerkleTree&)_1_>
            (in_stack_ffffffffffffffa8,obj,(anon_class_8_1_a7b7af8b *)in_stack_ffffffffffffff98);
  ActionUnserialize::
  SerRead<DataStream,CPartialMerkleTree&,CPartialMerkleTree::SerializationOps<DataStream,CPartialMerkleTree,ActionUnserialize>(CPartialMerkleTree&,DataStream&,ActionUnserialize)::_lambda(DataStream&,CPartialMerkleTree&)_2_>
            (in_stack_ffffffffffffffa8,obj,(anon_class_1_0_00000001 *)in_stack_ffffffffffffff98);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffffa8);
  if (*(_Bit_type **)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(CPartialMerkleTree, obj)
    {
        READWRITE(obj.nTransactions, obj.vHash);
        std::vector<unsigned char> bytes;
        SER_WRITE(obj, bytes = BitsToBytes(obj.vBits));
        READWRITE(bytes);
        SER_READ(obj, obj.vBits = BytesToBits(bytes));
        SER_READ(obj, obj.fBad = false);
    }